

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec3fa __thiscall embree::Parms::getVec3fa(Parms *this,char *name,Vec3fa *def)

{
  const_iterator cVar1;
  undefined4 *in_RCX;
  undefined4 uVar2;
  undefined4 uVar3;
  _Rb_tree_color _Var4;
  undefined4 uVar5;
  _Base_ptr in_XMM1_Qa;
  Vec3fa VVar6;
  allocator local_41;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,(char *)def,&local_41);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
                  *)name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((cVar1._M_node == (_Base_ptr)(name + 8)) || (cVar1._M_node[2]._M_color != 0xb)) {
    uVar2 = *in_RCX;
    uVar3 = in_RCX[1];
    _Var4 = in_RCX[2];
    uVar5 = in_RCX[3];
  }
  else {
    in_XMM1_Qa = cVar1._M_node[2]._M_parent;
    uVar2 = *(undefined4 *)&cVar1._M_node[2].field_0x4;
    uVar3 = SUB84(in_XMM1_Qa,0);
    _Var4 = (_Rb_tree_color)((ulong)in_XMM1_Qa >> 0x20);
    uVar5 = 0;
  }
  *(undefined4 *)&(this->m)._M_t._M_impl = uVar2;
  *(undefined4 *)&(this->m)._M_t._M_impl.field_0x4 = uVar3;
  (this->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var4;
  *(undefined4 *)&(this->m)._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = uVar5;
  VVar6.field_0.m128[1] = (float)uVar3;
  VVar6.field_0.m128[0] = (float)uVar2;
  VVar6.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar6.field_0;
}

Assistant:

Vec3fa getVec3fa(const char* name, const Vec3fa& def = zero) const {
      std::map<std::string,Variant>::const_iterator i = m.find(name);
      if (i == m.end() || (*i).second.type != Variant::FLOAT3) return def;
      return (*i).second.getVec3fa();
    }